

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O0

bool_t xdr_bytes(XDR *__xdrs,char **__cpp,u_int *__sizep,u_int __maxsize)

{
  xdr_op xVar1;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 uVar2;
  u_int maxsize_local;
  u_int *sizep_local;
  char **cpp_local;
  XDR *xdrs_local;
  
  xVar1 = __xdrs[2].x_op;
  if (xVar1 == XDR_ENCODE) {
    xdrs_local._7_1_ = xdr_bytes_encode((XDR *)__xdrs,__cpp,__sizep,__maxsize);
    uVar2 = extraout_var_00;
  }
  else if (xVar1 == XDR_DECODE) {
    xdrs_local._7_1_ = xdr_bytes_decode((XDR *)__xdrs,__cpp,__sizep,__maxsize);
    uVar2 = extraout_var;
  }
  else if (xVar1 == XDR_FREE) {
    xdrs_local._7_1_ = xdr_bytes_free((XDR *)__xdrs,__cpp,(ulong)*__sizep);
    uVar2 = extraout_var_01;
  }
  else {
    uVar2 = 0;
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR xdrs->x_op (%u)","xdr_bytes",0x2ab,(ulong)__xdrs[2].x_op);
      uVar2 = extraout_var_02;
    }
    xdrs_local._7_1_ = false;
  }
  return (bool_t)CONCAT71(uVar2,xdrs_local._7_1_);
}

Assistant:

static inline bool
xdr_bytes(XDR *xdrs, char **cpp, u_int *sizep, u_int maxsize)
{
	switch (xdrs->x_op) {
	case XDR_DECODE:
		return (xdr_bytes_decode(xdrs, cpp, sizep, maxsize));
	case XDR_ENCODE:
		return (xdr_bytes_encode(xdrs, cpp, sizep, maxsize));
	case XDR_FREE:
		return (xdr_bytes_free(xdrs, cpp, *sizep));
	}

	__warnx(TIRPC_DEBUG_FLAG_ERROR,
		"%s:%u ERROR xdrs->x_op (%u)",
		__func__, __LINE__,
		xdrs->x_op);
	return (false);
}